

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams_from_file.hpp
# Opt level: O0

void __thiscall
iutest::detail::iuCsvFileParamsGenerator<float>::iuCsvFileParamsGenerator
          (iuCsvFileParamsGenerator<float> *this,string *path,char delimiter)

{
  params_t local_38;
  char local_19;
  string *psStack_18;
  char delimiter_local;
  string *path_local;
  iuCsvFileParamsGenerator<float> *this_local;
  
  (this->super_iuValuesInParamsGenerator<float>).super_iuIParamGenerator<int>.
  _vptr_iuIParamGenerator = (_func_int **)&PTR__iuCsvFileParamsGenerator_0018e708;
  local_19 = delimiter;
  psStack_18 = path;
  path_local = (string *)this;
  ReadParams(&local_38,this,path,delimiter);
  iuValuesInParamsGenerator<float>::iuValuesInParamsGenerator
            (&this->super_iuValuesInParamsGenerator<float>,&local_38);
  std::vector<float,_std::allocator<float>_>::~vector(&local_38);
  (this->super_iuValuesInParamsGenerator<float>).super_iuIParamGenerator<int>.
  _vptr_iuIParamGenerator = (_func_int **)&PTR__iuCsvFileParamsGenerator_0018e708;
  return;
}

Assistant:

explicit iuCsvFileParamsGenerator(const ::std::string& path, char delimiter = ',')
        : iuValuesInParamsGenerator<T>(ReadParams(path, delimiter))
    {
    }